

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O0

void __thiscall rsg::ParenOp::tokenize(ParenOp *this,GeneratorState *state,TokenStream *str)

{
  TokenStream *this_00;
  Token local_50 [2];
  Token local_30;
  TokenStream *local_20;
  TokenStream *str_local;
  GeneratorState *state_local;
  ParenOp *this_local;
  
  local_20 = str;
  str_local = (TokenStream *)state;
  state_local = (GeneratorState *)this;
  Token::Token(&local_30,LEFT_PAREN);
  TokenStream::operator<<(str,&local_30);
  Token::~Token(&local_30);
  (*this->m_child->_vptr_Expression[3])(this->m_child,str_local,local_20);
  this_00 = local_20;
  Token::Token(local_50,RIGHT_PAREN);
  TokenStream::operator<<(this_00,local_50);
  Token::~Token(local_50);
  return;
}

Assistant:

void ParenOp::tokenize (GeneratorState& state, TokenStream& str) const
{
	str << Token::LEFT_PAREN;
	m_child->tokenize(state, str);
	str << Token::RIGHT_PAREN;
}